

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O0

void read_debug_scaling_list
               (bs_t *b,int *scalingList,int sizeOfScalingList,int *useDefaultScalingMatrixFlag)

{
  uint uVar1;
  int local_50;
  bool local_49;
  FILE *local_48;
  FILE *local_40;
  int local_38;
  int j;
  int delta_scale;
  int nextScale;
  int lastScale;
  int *useDefaultScalingMatrixFlag_local;
  int sizeOfScalingList_local;
  int *scalingList_local;
  bs_t *b_local;
  
  delta_scale = 8;
  j = 8;
  for (local_38 = 0; local_38 < sizeOfScalingList; local_38 = local_38 + 1) {
    if (j != 0) {
      if (h264_dbgfile == (FILE *)0x0) {
        local_40 = _stdout;
      }
      else {
        local_40 = (FILE *)h264_dbgfile;
      }
      fprintf(local_40,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      uVar1 = bs_read_se(b);
      if (h264_dbgfile == (FILE *)0x0) {
        local_48 = _stdout;
      }
      else {
        local_48 = (FILE *)h264_dbgfile;
      }
      fprintf(local_48,"delta_scale: %d \n",(ulong)uVar1);
      j = (int)(delta_scale + uVar1 + 0x100) % 0x100;
      local_49 = local_38 == 0 && j == 0;
      *useDefaultScalingMatrixFlag = (uint)local_49;
    }
    if (j == 0) {
      local_50 = delta_scale;
    }
    else {
      local_50 = j;
    }
    scalingList[local_38] = local_50;
    delta_scale = scalingList[local_38];
  }
  return;
}

Assistant:

void read_debug_scaling_list(bs_t* b, int* scalingList, int sizeOfScalingList, int* useDefaultScalingMatrixFlag )
{
    // NOTE need to be able to set useDefaultScalingMatrixFlag when reading, hence passing as pointer
    int lastScale = 8;
    int nextScale = 8;
    int delta_scale;
    for( int j = 0; j < sizeOfScalingList; j++ )
    {
        if( nextScale != 0 )
        {
            if( 0 )
            {
                nextScale = scalingList[ j ];
                if (useDefaultScalingMatrixFlag[0]) { nextScale = 0; }
                delta_scale = (nextScale - lastScale) % 256 ;
            }

            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); delta_scale = bs_read_se(b); printf("delta_scale: %d \n", delta_scale); 

            if( 1 )
            {
                nextScale = ( lastScale + delta_scale + 256 ) % 256;
                useDefaultScalingMatrixFlag[0] = ( j == 0 && nextScale == 0 );
            }
        }
        if( 1 )
        {
            scalingList[ j ] = ( nextScale == 0 ) ? lastScale : nextScale;
        }
        lastScale = scalingList[ j ];
    }
}